

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O3

void mbedtls_md_free(mbedtls_md_context_t *ctx)

{
  mbedtls_sha512_context *ctx_00;
  
  if ((ctx != (mbedtls_md_context_t *)0x0) && (ctx->md_info != (mbedtls_md_info_t *)0x0)) {
    ctx_00 = (mbedtls_sha512_context *)ctx->md_ctx;
    if (ctx_00 != (mbedtls_sha512_context *)0x0) {
      switch(ctx->md_info->type) {
      case MBEDTLS_MD_MD5:
        mbedtls_md5_free((mbedtls_md5_context *)ctx_00);
        break;
      case MBEDTLS_MD_SHA1:
        mbedtls_sha1_free((mbedtls_sha1_context *)ctx_00);
        break;
      case MBEDTLS_MD_SHA224:
      case MBEDTLS_MD_SHA256:
        mbedtls_sha256_free((mbedtls_sha256_context *)ctx_00);
        break;
      case MBEDTLS_MD_SHA384:
      case MBEDTLS_MD_SHA512:
        mbedtls_sha512_free(ctx_00);
        break;
      case MBEDTLS_MD_RIPEMD160:
        mbedtls_ripemd160_free((mbedtls_ripemd160_context *)ctx_00);
      }
      free(ctx->md_ctx);
    }
    if (ctx->hmac_ctx != (void *)0x0) {
      mbedtls_platform_zeroize(ctx->hmac_ctx,(ulong)((uint)ctx->md_info->block_size * 2));
      free(ctx->hmac_ctx);
    }
    mbedtls_platform_zeroize(ctx,0x18);
    return;
  }
  return;
}

Assistant:

void mbedtls_md_free( mbedtls_md_context_t *ctx )
{
    if( ctx == NULL || ctx->md_info == NULL )
        return;

    if( ctx->md_ctx != NULL )
    {
        switch( ctx->md_info->type )
        {
#if defined(MBEDTLS_MD2_C)
            case MBEDTLS_MD_MD2:
                mbedtls_md2_free( ctx->md_ctx );
                break;
#endif
#if defined(MBEDTLS_MD4_C)
            case MBEDTLS_MD_MD4:
                mbedtls_md4_free( ctx->md_ctx );
                break;
#endif
#if defined(MBEDTLS_MD5_C)
            case MBEDTLS_MD_MD5:
                mbedtls_md5_free( ctx->md_ctx );
                break;
#endif
#if defined(MBEDTLS_RIPEMD160_C)
            case MBEDTLS_MD_RIPEMD160:
                mbedtls_ripemd160_free( ctx->md_ctx );
                break;
#endif
#if defined(MBEDTLS_SHA1_C)
            case MBEDTLS_MD_SHA1:
                mbedtls_sha1_free( ctx->md_ctx );
                break;
#endif
#if defined(MBEDTLS_SHA256_C)
            case MBEDTLS_MD_SHA224:
            case MBEDTLS_MD_SHA256:
                mbedtls_sha256_free( ctx->md_ctx );
                break;
#endif
#if defined(MBEDTLS_SHA512_C)
#if !defined(MBEDTLS_SHA512_NO_SHA384)
            case MBEDTLS_MD_SHA384:
#endif
            case MBEDTLS_MD_SHA512:
                mbedtls_sha512_free( ctx->md_ctx );
                break;
#endif
            default:
                /* Shouldn't happen */
                break;
        }
        mbedtls_free( ctx->md_ctx );
    }

    if( ctx->hmac_ctx != NULL )
    {
        mbedtls_platform_zeroize( ctx->hmac_ctx,
                                  2 * ctx->md_info->block_size );
        mbedtls_free( ctx->hmac_ctx );
    }

    mbedtls_platform_zeroize( ctx, sizeof( mbedtls_md_context_t ) );
}